

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zutil.c
# Opt level: O1

void zFillRHS(trans_t trans,int nrhs,doublecomplex *x,int ldx,SuperMatrix *A,SuperMatrix *B)

{
  char transc [1];
  
  sp_zgemm(transc,"N",A->nrow,nrhs,A->ncol,(doublecomplex)ZEXT816(0x3ff0000000000000),A,x,ldx,
           (doublecomplex)ZEXT816(0),*(doublecomplex **)((long)B->Store + 8),*B->Store);
  return;
}

Assistant:

void
zFillRHS(trans_t trans, int nrhs, doublecomplex *x, int ldx,
         SuperMatrix *A, SuperMatrix *B)
{
    DNformat *Bstore;
    doublecomplex   *rhs;
    doublecomplex one = {1.0, 0.0};
    doublecomplex zero = {0.0, 0.0};
    int      ldc;
    char transc[1];

    //Astore = A->Store;
    //Aval   = (doublecomplex *) Astore->nzval;
    Bstore = B->Store;
    rhs    = Bstore->nzval;
    ldc    = Bstore->lda;
    
    if ( trans == NOTRANS ) *(unsigned char *)transc = 'N';
    else *(unsigned char *)transc = 'T';

    sp_zgemm(transc, "N", A->nrow, nrhs, A->ncol, one, A,
	     x, ldx, zero, rhs, ldc);

}